

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevcStreamReader.cpp
# Opt level: O3

CheckStreamRez * __thiscall
HEVCStreamReader::checkStream
          (CheckStreamRez *__return_storage_ptr__,HEVCStreamReader *this,uint8_t *buffer,int len)

{
  string *this_00;
  byte bVar1;
  byte bVar2;
  int iVar3;
  byte *buffer_00;
  byte *end;
  HevcVpsUnit *this_01;
  HevcSpsUnit *pHVar4;
  HevcPpsUnit *this_02;
  long lVar5;
  byte *end_00;
  byte *end_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->codecInfo).codecID = 0;
  (__return_storage_ptr__->codecInfo).displayName._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->codecInfo).displayName.field_2;
  (__return_storage_ptr__->codecInfo).displayName._M_string_length = 0;
  (__return_storage_ptr__->codecInfo).displayName.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->codecInfo).programName._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->codecInfo).programName.field_2;
  (__return_storage_ptr__->codecInfo).programName._M_string_length = 0;
  (__return_storage_ptr__->codecInfo).programName.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->streamDescr)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->streamDescr).field_2;
  (__return_storage_ptr__->streamDescr)._M_string_length = 0;
  (__return_storage_ptr__->streamDescr).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->lang)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->lang).field_2
  ;
  (__return_storage_ptr__->lang)._M_string_length = 0;
  (__return_storage_ptr__->lang).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->trackID = 0;
  __return_storage_ptr__->delay = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->delay + 7) = 0;
  end_01 = buffer + len;
  buffer_00 = NALUnit::findNextNAL(buffer,end_01);
  this_00 = &__return_storage_ptr__->streamDescr;
  for (; buffer_00 < end_01 + -4; buffer_00 = NALUnit::findNextNAL(buffer_00,end_01)) {
    bVar1 = *buffer_00;
    if ((char)bVar1 < '\0') {
      return __return_storage_ptr__;
    }
    end = NALUnit::findNALWithStartCode(buffer_00,end_01,true);
    if ((end == end_01) && ((this->super_MPEGStreamReader).m_eof == false)) break;
    bVar2 = bVar1 >> 1;
    switch((uint)bVar2) {
    case 0x20:
      this_01 = this->m_vps;
      if (this_01 == (HevcVpsUnit *)0x0) {
        this_01 = (HevcVpsUnit *)operator_new(0x50);
        HevcVpsUnit::HevcVpsUnit(this_01);
        this->m_vps = this_01;
      }
      HevcUnit::decodeBuffer((HevcUnit *)this_01,buffer_00,end);
      iVar3 = HevcVpsUnit::deserialize(this->m_vps);
      if (iVar3 != 0) {
        return __return_storage_ptr__;
      }
      (this->super_MPEGStreamReader).m_spsPpsFound = true;
      if (this->m_vps->num_units_in_tick != 0) {
        MPEGStreamReader::updateFPS(&this->super_MPEGStreamReader,this->m_vps,buffer_00,end,0);
      }
      break;
    case 0x21:
      pHVar4 = this->m_sps;
      if (pHVar4 == (HevcSpsUnit *)0x0) {
        pHVar4 = (HevcSpsUnit *)operator_new(0xa0);
        HevcSpsUnit::HevcSpsUnit(pHVar4);
        this->m_sps = pHVar4;
      }
      HevcUnit::decodeBuffer((HevcUnit *)pHVar4,buffer_00,end);
      iVar3 = HevcSpsUnit::deserialize(this->m_sps);
      if (iVar3 != 0) {
        return __return_storage_ptr__;
      }
      (this->super_MPEGStreamReader).m_spsPpsFound = true;
      MPEGStreamReader::updateFPS(&this->super_MPEGStreamReader,this->m_sps,buffer_00,end,0);
      break;
    case 0x22:
      this_02 = this->m_pps;
      if (this_02 == (HevcPpsUnit *)0x0) {
        this_02 = (HevcPpsUnit *)operator_new(0x48);
        HevcPpsUnit::HevcPpsUnit(this_02);
        this->m_pps = this_02;
      }
      HevcUnit::decodeBuffer(&this_02->super_HevcUnit,buffer_00,end);
      iVar3 = HevcPpsUnit::deserialize(this->m_pps);
      goto LAB_0018b662;
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
      break;
    case 0x27:
      HevcUnit::decodeBuffer(&this->m_hdr->super_HevcUnit,buffer_00,end);
      iVar3 = HevcHdrUnit::deserialize(this->m_hdr);
LAB_0018b662:
      if (iVar3 != 0) {
        return __return_storage_ptr__;
      }
      break;
    default:
      if ((bVar2 - 0x3e < 2) && (buffer_00[1] == 1)) {
        if (bVar2 == 0x3f) {
          this->m_hdr->isDVEL = true;
        }
        else {
          this->m_hdr->isDVRPU = true;
        }
        V3_flags._0_1_ = (byte)V3_flags | 4;
      }
    }
    if ((((this->m_sps != (HevcSpsUnit *)0x0) && (this->m_vps != (HevcVpsUnit *)0x0)) &&
        (this->m_pps != (HevcPpsUnit *)0x0)) &&
       ((bVar1 < 0x14 || (bVar1 & 0x70) == 0x20 && ((char)buffer_00[2] < '\0')))) {
      end_00 = buffer_00 + 0x40;
      if (end < buffer_00 + 0x40) {
        end_00 = end;
      }
      HevcUnit::decodeBuffer(&this->m_slice->super_HevcUnit,buffer_00,end_00);
      iVar3 = HevcSliceHeader::deserialize(this->m_slice,this->m_sps,this->m_pps);
      if (iVar3 != 0) {
        return __return_storage_ptr__;
      }
      iVar3 = toFullPicOrder(this,this->m_slice,this->m_sps->log2_max_pic_order_cnt_lsb);
      this->m_fullPicOrder = iVar3;
      incTimings(this);
    }
  }
  this->m_frameNum = 0;
  this->m_fullPicOrder = 0;
  (this->super_MPEGStreamReader).m_totalFrameNum = 0;
  (this->super_MPEGStreamReader).m_curPts = 0;
  (this->super_MPEGStreamReader).m_curDts = 0;
  if (((this->m_vps != (HevcVpsUnit *)0x0) && (pHVar4 = this->m_sps, pHVar4 != (HevcSpsUnit *)0x0))
     && ((this->m_pps != (HevcPpsUnit *)0x0 &&
         ((*(uint *)&(this->m_vps->super_HevcUnitWithProfile).field_0x3c ==
           (uint)(byte)(pHVar4->super_HevcUnitWithProfile).field_0x3b &&
          (this->m_pps->sps_id == pHVar4->sps_id)))))) {
    if ((pHVar4->colour_primaries == '\t') &&
       ((pHVar4->transfer_characteristics == '\x10' && (pHVar4->matrix_coeffs == '\t')))) {
      this->m_hdr->isHDR10 = true;
      V3_flags._0_1_ = (byte)V3_flags | 2;
    }
    (__return_storage_ptr__->codecInfo).codecID = ::hevcCodecInfo.codecID;
    std::__cxx11::string::_M_assign((string *)&(__return_storage_ptr__->codecInfo).displayName);
    std::__cxx11::string::_M_assign((string *)&(__return_storage_ptr__->codecInfo).programName);
    HevcSpsUnit::getDescription_abi_cxx11_(&local_b0,this->m_sps);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    lVar5 = std::__cxx11::string::find((char *)this_00,0x205a33,0);
    if (lVar5 != -1) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)this_00);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0," ","");
      std::operator+(&local_50,&local_70,&local_d0);
      HevcVpsUnit::getDescription_abi_cxx11_(&local_90,this->m_vps);
      std::operator+(&local_b0,&local_50,&local_90);
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CheckStreamRez HEVCStreamReader::checkStream(uint8_t* buffer, const int len)
{
    CheckStreamRez rez;

    uint8_t* end = buffer + len;
    for (uint8_t* nal = NALUnit::findNextNAL(buffer, end); nal < end - 4; nal = NALUnit::findNextNAL(nal, end))
    {
        if (*nal & 0x80)
            return rez;  // invalid nal
        const auto nalType = static_cast<HevcUnit::NalType>((*nal >> 1) & 0x3f);
        uint8_t* nextNal = NALUnit::findNALWithStartCode(nal, end, true);
        if (!m_eof && nextNal == end)
            break;

        switch (nalType)
        {
        case HevcUnit::NalType::VPS:
            if (!m_vps)
                m_vps = new HevcVpsUnit();
            m_vps->decodeBuffer(nal, nextNal);
            if (m_vps->deserialize() != 0)
                return rez;
            m_spsPpsFound = true;
            if (m_vps->num_units_in_tick)
                updateFPS(m_vps, nal, nextNal, 0);
            break;
        case HevcUnit::NalType::SPS:
            if (!m_sps)
                m_sps = new HevcSpsUnit();
            m_sps->decodeBuffer(nal, nextNal);
            if (m_sps->deserialize() != 0)
                return rez;
            m_spsPpsFound = true;
            updateFPS(m_sps, nal, nextNal, 0);
            break;
        case HevcUnit::NalType::PPS:
            if (!m_pps)
                m_pps = new HevcPpsUnit();
            m_pps->decodeBuffer(nal, nextNal);
            if (m_pps->deserialize() != 0)
                return rez;
            break;
        case HevcUnit::NalType::SEI_PREFIX:
            m_hdr->decodeBuffer(nal, nextNal);
            if (m_hdr->deserialize() != 0)
                return rez;
            break;
        case HevcUnit::NalType::DVRPU:
        case HevcUnit::NalType::DVEL:
            if (nal[1] == 1)
            {
                if (nalType == HevcUnit::NalType::DVEL)
                    m_hdr->isDVEL = true;
                else
                    m_hdr->isDVRPU = true;
                V3_flags |= DV;
            }
            break;
        default:
            break;
        }

        // check Frame Depth on first slices
        if (isSlice(nalType) && (nal[2] & 0x80))
        {
            m_slice->decodeBuffer(nal, FFMIN(nal + MAX_SLICE_HEADER, nextNal));
            if (m_slice->deserialize(m_sps, m_pps))
                return rez;  // not enough buffer or error
            m_fullPicOrder = toFullPicOrder(m_slice, m_sps->log2_max_pic_order_cnt_lsb);
            incTimings();
        }
    }
    m_totalFrameNum = m_frameNum = m_fullPicOrder = 0;
    m_curDts = m_curPts = 0;

    // Set HDR10 flag if PQ detected
    if (m_vps && m_sps && m_pps && m_sps->vps_id == m_vps->vps_id && m_pps->sps_id == m_sps->sps_id)
    {
        if (m_sps->colour_primaries == 9 && m_sps->transfer_characteristics == 16 &&
            m_sps->matrix_coeffs == 9)  // SMPTE.ST.2084 (PQ)
        {
            m_hdr->isHDR10 = true;
            V3_flags |= HDR10;
        }

        rez.codecInfo = hevcCodecInfo;
        rez.streamDescr = m_sps->getDescription();
        const size_t frSpsPos = rez.streamDescr.find("Frame rate: not found");
        if (frSpsPos != string::npos)
            rez.streamDescr = rez.streamDescr.substr(0, frSpsPos) + string(" ") + m_vps->getDescription();
    }

    return rez;
}